

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

uint ON_ManagedFonts::GetGlyphMetricsInFontDesignUnits
               (ON_Font *font,ON__UINT32 unicode_code_point,
               ON_TextBox *glyph_metrics_in_font_design_units)

{
  undefined1 local_90 [8];
  ON_FontGlyph g;
  uint glyph_index;
  ON_TextBox *glyph_metrics_in_font_design_units_local;
  ON__UINT32 unicode_code_point_local;
  ON_Font *font_local;
  
  g.m_substitute._4_4_ = 0;
  ON_FontGlyph::ON_FontGlyph((ON_FontGlyph *)local_90,font,unicode_code_point);
  if ((ON_Font::Internal_CustomGetGlyphMetricsFunc == (ON_GetGlyphMetricsFuncType)0x0) ||
     (g.m_substitute._4_4_ =
           (*ON_Font::Internal_CustomGetGlyphMetricsFunc)
                     ((ON_FontGlyph *)local_90,glyph_metrics_in_font_design_units),
     font_local._4_4_ = g.m_substitute._4_4_, g.m_substitute._4_4_ == 0)) {
    if (g.m_substitute._4_4_ == 0) {
      glyph_metrics_in_font_design_units->m_bbmin = ON_TextBox::Unset.m_bbmin;
      glyph_metrics_in_font_design_units->m_bbmax = ON_TextBox::Unset.m_bbmax;
      glyph_metrics_in_font_design_units->m_max_basepoint = ON_TextBox::Unset.m_max_basepoint;
      glyph_metrics_in_font_design_units->m_advance = ON_TextBox::Unset.m_advance;
      font_local._4_4_ = 0;
    }
    else {
      font_local._4_4_ = g.m_substitute._4_4_;
    }
  }
  return font_local._4_4_;
}

Assistant:

unsigned int ON_ManagedFonts::GetGlyphMetricsInFontDesignUnits(
  const class ON_Font* font,
  ON__UINT32 unicode_code_point,
  class ON_TextBox& glyph_metrics_in_font_design_units
)
{
  unsigned int glyph_index = 0;

  const ON_FontGlyph g(font, unicode_code_point);

  if (nullptr != ON_Font::Internal_CustomGetGlyphMetricsFunc)
  {
    glyph_index = ON_Font::Internal_CustomGetGlyphMetricsFunc(&g, glyph_metrics_in_font_design_units);
    if (0 != glyph_index)
      return glyph_index;
  }

#if defined(ON_OS_WINDOWS_GDI)
  glyph_index = ON_WindowsDWriteGetGlyphMetrics(&g, glyph_metrics_in_font_design_units);
#elif defined(ON_RUNTIME_APPLE_CORE_TEXT_AVAILABLE)
  glyph_index = ON_AppleFontGetGlyphMetrics(&g, glyph_metrics_in_font_design_units);
#elif defined(OPENNURBS_FREETYPE_SUPPORT)
  // Look in opennurbs_system_rumtime.h for the correct place to define OPENNURBS_FREETYPE_SUPPORT.
  // Do NOT define OPENNURBS_FREETYPE_SUPPORT here or in your project setting ("makefile").
  glyph_index = ON_FreeTypeGetGlyphMetrics(&g, glyph_metrics_in_font_design_units);
#endif

  if (0 != glyph_index)
    return glyph_index;

  glyph_metrics_in_font_design_units = ON_TextBox::Unset;
  return 0;
}